

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O3

pcp_flow_event_e fhndl_waitresp(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  pcp_flow_event_e pVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  lVar5 = (f->timeout).tv_usec;
  lVar3 = lVar5 / 1000000 + (f->timeout).tv_sec;
  (f->timeout).tv_sec = lVar3;
  uVar2 = lVar5 % 1000000;
  (f->timeout).tv_usec = uVar2;
  if ((long)uVar2 < 0) {
    uVar2 = uVar2 + 1000000;
    (f->timeout).tv_usec = uVar2;
    lVar3 = lVar3 + -1;
    (f->timeout).tv_sec = lVar3;
  }
  uVar4 = local_18.tv_usec % 1000000;
  uVar6 = uVar4 + 1000000;
  if (-1 < (long)uVar4) {
    uVar6 = uVar4;
  }
  lVar5 = ((long)uVar4 >> 0x3f) + local_18.tv_usec / 1000000 + local_18.tv_sec;
  pVar1 = fev_failed;
  if ((lVar5 <= lVar3) && (pVar1 = fev_none, lVar3 <= lVar5)) {
    pVar1 = fev_none - (uVar2 < uVar6);
  }
  return pVar1;
}

Assistant:

static pcp_flow_event_e fhndl_waitresp(pcp_flow_t *f,
                                       UNUSED pcp_recv_msg_t *msg) {
    struct timeval ctv;

    gettimeofday(&ctv, NULL);
    if (timeval_comp(&f->timeout, &ctv) < 0) {
        return fev_failed;
    }

    return fev_none;
}